

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3TransferBindings(sqlite3_stmt *pFromStmt,sqlite3_stmt *pToStmt)

{
  Mem *in_RSI;
  long in_RDI;
  int i;
  Vdbe *pTo;
  Vdbe *pFrom;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar1;
  
  sqlite3_mutex_enter((sqlite3_mutex *)0x1419ab);
  for (iVar1 = 0; iVar1 < *(short *)(in_RDI + 0x20); iVar1 = iVar1 + 1) {
    sqlite3VdbeMemMove(in_RSI,(Mem *)CONCAT44(iVar1,in_stack_ffffffffffffffd8));
  }
  sqlite3_mutex_leave((sqlite3_mutex *)0x141a17);
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3TransferBindings(sqlite3_stmt *pFromStmt, sqlite3_stmt *pToStmt){
  Vdbe *pFrom = (Vdbe*)pFromStmt;
  Vdbe *pTo = (Vdbe*)pToStmt;
  int i;
  assert( pTo->db==pFrom->db );
  assert( pTo->nVar==pFrom->nVar );
  sqlite3_mutex_enter(pTo->db->mutex);
  for(i=0; i<pFrom->nVar; i++){
    sqlite3VdbeMemMove(&pTo->aVar[i], &pFrom->aVar[i]);
  }
  sqlite3_mutex_leave(pTo->db->mutex);
  return SQLITE_OK;
}